

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

TEXTURE_FORMAT Diligent::TypelessFormatToSRGB(TEXTURE_FORMAT Fmt)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,Fmt);
  if (iVar1 == 0x1b) {
    return TEX_FORMAT_RGBA8_UNORM_SRGB;
  }
  if (iVar1 == 0x61) {
    return TEX_FORMAT_BC7_UNORM_SRGB;
  }
  if (iVar1 == 0x49) {
    return TEX_FORMAT_BC2_UNORM_SRGB;
  }
  if (iVar1 != 0x4c) {
    if (iVar1 == 0x5a) {
      return TEX_FORMAT_BGRA8_UNORM_SRGB;
    }
    if (iVar1 != 0x5c) {
      if (iVar1 == 0x46) {
        iVar1 = 0x48;
      }
      return (TEXTURE_FORMAT)iVar1;
    }
    return TEX_FORMAT_BGRX8_UNORM_SRGB;
  }
  return TEX_FORMAT_BC3_UNORM_SRGB;
}

Assistant:

TEXTURE_FORMAT TypelessFormatToSRGB(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_RGBA8_TYPELESS:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        case TEX_FORMAT_BC1_TYPELESS:
            return TEX_FORMAT_BC1_UNORM_SRGB;

        case TEX_FORMAT_BC2_TYPELESS:
            return TEX_FORMAT_BC2_UNORM_SRGB;

        case TEX_FORMAT_BC3_TYPELESS:
            return TEX_FORMAT_BC3_UNORM_SRGB;

        case TEX_FORMAT_BGRA8_TYPELESS:
            return TEX_FORMAT_BGRA8_UNORM_SRGB;

        case TEX_FORMAT_BGRX8_TYPELESS:
            return TEX_FORMAT_BGRX8_UNORM_SRGB;

        case TEX_FORMAT_BC7_TYPELESS:
            return TEX_FORMAT_BC7_UNORM_SRGB;

        default:
            return Fmt;
    }
}